

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Point3<pbrt::Interval<float>_> * __thiscall
pbrt::Tuple3<pbrt::Point3,pbrt::Interval<float>>::operator/
          (Point3<pbrt::Interval<float>_> *__return_storage_ptr__,
          Tuple3<pbrt::Point3,pbrt::Interval<float>> *this,float d)

{
  Interval<float> IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  enable_if_t<std::is_arithmetic<float>::value,_Interval<float>_> eVar4;
  enable_if_t<std::is_arithmetic<float>::value,_Interval<float>_> eVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  
  eVar4 = pbrt::operator/(*(Interval<float> *)this,d);
  eVar5 = pbrt::operator/(*(Interval<float> *)(this + 8),d);
  auVar6._0_8_ = pbrt::operator/(*(Interval<float> *)(this + 0x10),d);
  auVar6._8_56_ = extraout_var;
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_4_ = eVar4.low;
  auVar3._4_4_ = eVar4.high;
  auVar2._8_8_ = extraout_XMM0_Qb_00;
  auVar2._0_4_ = eVar5.low;
  auVar2._4_4_ = eVar5.high;
  auVar2 = vunpcklpd_avx(auVar3,auVar2);
  (__return_storage_ptr__->super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low =
       (float)(int)auVar2._0_8_;
  (__return_storage_ptr__->super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.high =
       (float)(int)((ulong)auVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).y.low =
       (float)(int)auVar2._8_8_;
  (__return_storage_ptr__->super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).y.high =
       (float)(int)((ulong)auVar2._8_8_ >> 0x20);
  IVar1 = (Interval<float>)vmovlps_avx(auVar6._0_16_);
  (__return_storage_ptr__->super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).z = IVar1;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU auto operator/(U d) const -> Child<decltype(T{} / U{})> {
        DCHECK_NE(d, 0);
        return {x / d, y / d, z / d};
    }